

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

vector<char,_std::allocator<char>_> * __thiscall
wasm::read_file<std::vector<char,std::allocator<char>>>
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,wasm *this,string *filename,
          BinaryOption binary)

{
  bool bVar1;
  char cVar2;
  ostream *poVar3;
  size_type __n;
  string local_3c0 [8];
  ifstream infile;
  undefined1 local_1b8 [399];
  allocator_type local_29;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                          "-");
  if (bVar1) {
    read_stdin();
    return __return_storage_ptr__;
  }
  bVar1 = isDebugEnabled("file");
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Loading \'");
    poVar3 = std::operator<<(poVar3,(string *)this);
    std::operator<<(poVar3,"\'...\n");
  }
  std::ifstream::ifstream(local_3c0);
  Path::to_path((PathString *)local_1b8,(string *)this);
  std::ifstream::open(local_3c0,(_Ios_Openmode)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    Fatal::Fatal((Fatal *)local_1b8);
    std::operator<<((ostream *)(local_1b8 + 0x10),"Failed opening \'");
    std::operator<<((ostream *)(local_1b8 + 0x10),(string *)this);
    Fatal::operator<<((Fatal *)local_1b8,(char (*) [2])0xe7a322);
  }
  else {
    std::istream::seekg((long)local_3c0,_S_beg);
    __n = std::istream::tellg();
    if (__n != 0xffffffffffffffff) {
      local_1b8[0] = (string)0x0;
      std::vector<char,_std::allocator<char>_>::vector
                (__return_storage_ptr__,__n,local_1b8,&local_29);
      if (__n != 0) {
        std::istream::seekg(local_3c0,0,0);
        std::istream::read((char *)local_3c0,
                           (long)(__return_storage_ptr__->
                                 super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                 super__Vector_impl_data._M_start);
        if ((int)filename == 1) {
          std::vector<char,_std::allocator<char>_>::resize(__return_storage_ptr__,_infile);
        }
      }
      std::ifstream::~ifstream(local_3c0);
      return __return_storage_ptr__;
    }
    Fatal::Fatal((Fatal *)local_1b8);
    poVar3 = (ostream *)(local_1b8 + 0x10);
    std::operator<<(poVar3,"Failed opening \'");
    std::operator<<(poVar3,(string *)this);
    std::operator<<(poVar3,"\': Input file too large: ");
    std::ostream::_M_insert<long>((long)poVar3);
    Fatal::operator<<((Fatal *)local_1b8,(char (*) [39])" bytes. Try rebuilding in 64-bit mode.");
  }
  Fatal::~Fatal((Fatal *)local_1b8);
}

Assistant:

T wasm::read_file(const std::string& filename, Flags::BinaryOption binary) {
  if (filename == "-") {
    return do_read_stdin<T>{}();
  }
  BYN_TRACE("Loading '" << filename << "'...\n");
  std::ifstream infile;
  std::ios_base::openmode flags = std::ifstream::in;
  if (binary == Flags::Binary) {
    flags |= std::ifstream::binary;
  }
  infile.open(wasm::Path::to_path(filename), flags);
  if (!infile.is_open()) {
    Fatal() << "Failed opening '" << filename << "'";
  }
  infile.seekg(0, std::ios::end);
  std::streampos insize = infile.tellg();
  if (uint64_t(insize) >= std::numeric_limits<size_t>::max()) {
    // Building a 32-bit executable where size_t == 32 bits, we are not able to
    // create strings larger than 2^32 bytes in length, so must abort here.
    Fatal() << "Failed opening '" << filename
            << "': Input file too large: " << insize
            << " bytes. Try rebuilding in 64-bit mode.";
  }
  // Zero-initialize the string or vector with the expected size.
  T input(size_t(insize), '\0');
  if (size_t(insize) == 0) {
    return input;
  }
  infile.seekg(0);
  infile.read(&input[0], insize);
  if (binary == Flags::Text) {
    size_t chars = size_t(infile.gcount());
    // Truncate size to the number of ASCII characters actually read in text
    // mode (which is generally less than the number of bytes on Windows, if
    // \r\n line endings are present)
    input.resize(chars);
  }
  return input;
}